

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_statemach_act(connectdata *conn)

{
  anon_union_232_11_d5d90c2a_for_proto *pp;
  uint *puVar1;
  curl_off_t *pcVar2;
  curl_socket_t sockfd;
  curl_usessl cVar3;
  void *pvVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  _Bool _Var8;
  CURLcode CVar9;
  uint uVar10;
  int iVar11;
  CURLofft CVar12;
  size_t sVar13;
  char *pcVar14;
  size_t sVar15;
  Curl_easy *pCVar16;
  ulong uVar17;
  byte *ptr;
  char *pcVar18;
  int imapcode;
  curl_off_t size;
  size_t nread;
  int local_6c;
  size_t local_68 [3];
  ulong local_50;
  SASL *local_48;
  size_t local_40;
  char *local_38;
  
  sockfd = conn->sock[0];
  local_40 = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar9 = imap_perform_upgrade_tls(conn);
    return CVar9;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar9 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar9;
  }
  local_48 = &(conn->proto).imapc.sasl;
  do {
    CVar9 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,&local_6c,&local_40);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if (local_6c == -1) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (local_6c == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      if (local_6c != 1) {
        pCVar16 = conn->data;
        if (local_6c != 3) {
          Curl_failf(pCVar16,"Got unexpected imap-server response");
          CVar9 = CURLE_WEIRD_SERVER_REPLY;
          break;
        }
        (conn->proto).imapc.preauth = true;
        Curl_infof(pCVar16,"PREAUTH connection, already authenticated!\n");
      }
      *(undefined4 *)((long)&conn->proto + 0x84) = 0;
      *(undefined4 *)((long)&conn->proto + 0x8c) = 0;
      (conn->proto).imapc.tls_supported = false;
      CVar9 = imap_sendf(conn,"CAPABILITY");
      if (CVar9 == CURLE_OK) {
        (conn->proto).imapc.state = IMAP_CAPABILITY;
      }
      break;
    case IMAP_CAPABILITY:
      pCVar16 = conn->data;
      if (local_6c == 1) {
        cVar3 = (pCVar16->set).use_ssl;
        if ((cVar3 != CURLUSESSL_NONE) && ((conn->ssl[0].field_0x10 & 1) == 0)) {
          if ((conn->proto).imapc.tls_supported == true) {
            CVar9 = imap_sendf(conn,"STARTTLS");
            if (CVar9 == CURLE_OK) {
              (conn->proto).imapc.state = IMAP_STARTTLS;
            }
            break;
          }
          if (cVar3 != CURLUSESSL_TRY) {
            pcVar14 = "STARTTLS not supported.";
            goto LAB_0013396c;
          }
        }
LAB_00133b29:
        CVar9 = imap_perform_authentication(conn);
        break;
      }
      if (local_6c != 0x2a) goto LAB_00133b29;
      ptr = (byte *)((pCVar16->state).buffer + 2);
LAB_001336d8:
      do {
        uVar17 = (ulong)*ptr;
        if (uVar17 < 0x21) {
          if ((0x100002600U >> (uVar17 & 0x3f) & 1) != 0) {
            ptr = ptr + 1;
            goto LAB_001336d8;
          }
          if (uVar17 != 0) goto LAB_00133703;
          bVar6 = false;
        }
        else {
LAB_00133703:
          uVar17 = 0;
          while ((0x20 < (ulong)ptr[uVar17] ||
                 ((0x100002601U >> ((ulong)ptr[uVar17] & 0x3f) & 1) == 0))) {
            uVar17 = uVar17 + 1;
          }
          if (uVar17 == 7) {
            if (*(int *)(ptr + 3) != 0x52492d4c || *(int *)ptr != 0x4c534153) goto LAB_00133796;
            (conn->proto).imapc.ir_supported = true;
            sVar15 = 7;
          }
          else if (uVar17 == 0xd) {
            if (*(long *)(ptr + 5) != 0x44454c4241534944 || *(long *)ptr != 0x5349444e49474f4c)
            goto LAB_00133796;
            (conn->proto).imapc.login_disabled = true;
            sVar15 = 0xd;
          }
          else if ((uVar17 == 8) && (*(long *)ptr == 0x534c545452415453)) {
            (conn->proto).imapc.tls_supported = true;
            sVar15 = 8;
          }
          else {
LAB_00133796:
            sVar15 = uVar17;
            if ((5 < uVar17) && (ptr[4] == 0x3d && *(int *)ptr == 0x48545541)) {
              ptr = ptr + 5;
              sVar15 = uVar17 - 5;
              uVar10 = Curl_sasl_decode_mech((char *)ptr,sVar15,local_68);
              if ((uVar10 != 0) && (local_68[0] + 5 == uVar17)) {
                puVar1 = (uint *)((long)&conn->proto + 0x84);
                *puVar1 = *puVar1 | uVar10;
              }
            }
          }
          ptr = ptr + sVar15;
          bVar6 = true;
        }
      } while (bVar6);
      goto LAB_00133914;
    case IMAP_STARTTLS:
      if (local_6c == 1) {
        CVar9 = imap_perform_upgrade_tls(conn);
      }
      else {
        pCVar16 = conn->data;
        if ((pCVar16->set).use_ssl == CURLUSESSL_TRY) goto LAB_00133b29;
        pcVar14 = "STARTTLS denied";
LAB_0013396c:
        Curl_failf(pCVar16,pcVar14);
        CVar9 = CURLE_USE_SSL_FAILED;
      }
      break;
    default:
      goto switchD_00133576_caseD_4;
    case IMAP_AUTHENTICATE:
      pCVar16 = conn->data;
      CVar9 = Curl_sasl_continue(local_48,conn,local_6c,(saslprogress *)local_68);
      if (CVar9 == CURLE_OK) {
        if ((saslprogress)local_68[0] == SASL_IDLE) {
          if (((conn->proto).imapc.login_disabled == false) &&
             (((conn->proto).ftpc.cwdfail & 1U) != 0)) {
            CVar9 = imap_perform_login(conn);
          }
          else {
            Curl_failf(pCVar16,"Authentication cancelled");
            CVar9 = CURLE_LOGIN_DENIED;
          }
        }
        else {
          CVar9 = CURLE_OK;
          if ((saslprogress)local_68[0] == SASL_DONE) goto LAB_00133ace;
        }
      }
      break;
    case IMAP_LOGIN:
      if (local_6c == 1) goto switchD_00133576_caseD_4;
      Curl_failf(conn->data,"Access denied. %c");
LAB_00133a67:
      CVar9 = CURLE_LOGIN_DENIED;
      break;
    case IMAP_LIST:
    case IMAP_SEARCH:
      if (local_6c == 1) goto switchD_00133576_caseD_4;
      CVar9 = CURLE_QUOTE_ERROR;
      if (local_6c == 0x2a) {
        pcVar14 = (conn->data->state).buffer;
        sVar13 = strlen(pcVar14);
        pcVar14[sVar13] = '\n';
        CVar9 = Curl_client_write(conn,1,pcVar14,sVar13 + 1);
        pcVar14[sVar13] = '\0';
      }
      break;
    case IMAP_SELECT:
      pCVar16 = conn->data;
      if (local_6c != 1) {
        if (local_6c == 0x2a) {
          iVar11 = __isoc99_sscanf((pCVar16->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",
                                   local_68);
          if (iVar11 == 1) {
            (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
            (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
            pcVar14 = (*Curl_cstrdup)((char *)local_68);
            (conn->proto).imapc.mailbox_uidvalidity = pcVar14;
          }
          goto LAB_00133914;
        }
        Curl_failf(pCVar16,"Select failed");
        goto LAB_00133a67;
      }
      pvVar4 = (pCVar16->req).protop;
      if (((*(char **)((long)pvVar4 + 0x10) == (char *)0x0) ||
          (pcVar14 = (conn->proto).imapc.mailbox_uidvalidity, pcVar14 == (char *)0x0)) ||
         (iVar11 = Curl_strcasecompare(*(char **)((long)pvVar4 + 0x10),pcVar14), iVar11 != 0)) {
        pcVar14 = (*Curl_cstrdup)(*(char **)((long)pvVar4 + 8));
        (conn->proto).imapc.mailbox = pcVar14;
        if (*(long *)((long)pvVar4 + 0x40) == 0) {
          if (*(long *)((long)pvVar4 + 0x38) == 0) {
            CVar9 = imap_perform_fetch(conn);
          }
          else {
            CVar9 = imap_perform_search(conn);
          }
        }
        else {
          CVar9 = imap_perform_list(conn);
        }
      }
      else {
        Curl_failf(conn->data,"Mailbox UIDVALIDITY has changed");
        CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
      break;
    case IMAP_FETCH:
      pCVar16 = conn->data;
      pcVar14 = (pCVar16->state).buffer;
      local_68[0] = 0;
      pcVar18 = pcVar14;
      if (local_6c == 0x2a) {
        while( true ) {
          if (*pcVar14 == '\0') break;
          if (*pcVar14 == '{') {
            CVar12 = curlx_strtoofft(pcVar14 + 1,&local_38,10,(curl_off_t *)local_68);
            if ((((CVar12 == CURL_OFFT_OK) && (1 < (long)local_38 - (long)pcVar18)) &&
                (*local_38 == '}')) && ((local_38[1] == '\r' && (local_38[2] == '\0')))) {
              CVar9 = CURLE_OK;
              Curl_infof(pCVar16,"Found %ld bytes to download\n",local_68[0]);
              Curl_pgrsSetDownloadSize(pCVar16,local_68[0]);
              pcVar14 = (pp->ftpc).pp.cache;
              if (pcVar14 != (char *)0x0) {
                uVar17 = (conn->proto).ftpc.pp.cache_size;
                sVar15 = local_68[0];
                if (uVar17 < local_68[0]) {
                  sVar15 = uVar17;
                }
                if (sVar15 == 0) {
                  (conn->proto).imapc.state = IMAP_STOP;
                  CVar9 = CURLE_OK;
LAB_00133c13:
                  bVar6 = false;
                }
                else {
                  local_50 = sVar15;
                  CVar9 = Curl_client_write(conn,1,pcVar14,sVar15);
                  uVar17 = local_50;
                  if (CVar9 != CURLE_OK) goto LAB_00133c13;
                  pcVar2 = &(pCVar16->req).bytecount;
                  *pcVar2 = *pcVar2 + local_50;
                  Curl_infof(pCVar16,"Written %zu bytes, %lu bytes are left for transfer\n",local_50
                            );
                  uVar7 = local_50;
                  uVar5 = (conn->proto).ftpc.pp.cache_size;
                  sVar13 = uVar5 - uVar17;
                  if (uVar5 < uVar17 || sVar13 == 0) {
                    (*Curl_cfree)((pp->ftpc).pp.cache);
                    (pp->ftpc).pp.cache = (char *)0x0;
                    sVar15 = 0;
                  }
                  else {
                    memmove((conn->proto).rtmp,(void *)((long)(conn->proto).rtmp + local_50),sVar13)
                    ;
                    sVar15 = (conn->proto).ftpc.pp.cache_size - uVar7;
                  }
                  (conn->proto).ftpc.pp.cache_size = sVar15;
                  bVar6 = true;
                  CVar9 = CURLE_OK;
                }
                if (!bVar6) goto LAB_00133b34;
              }
              if ((pCVar16->req).bytecount == local_68[0]) {
                iVar11 = -1;
                uVar17 = 0xffffffffffffffff;
              }
              else {
                (pCVar16->req).maxdownload = local_68[0];
                iVar11 = 0;
                uVar17 = local_68[0];
              }
              Curl_setup_transfer(pCVar16,iVar11,uVar17,false,-1);
              goto LAB_00133ace;
            }
            break;
          }
          pcVar14 = pcVar14 + 1;
          pcVar18 = pcVar18 + 1;
        }
        Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
        CVar9 = CURLE_WEIRD_SERVER_REPLY;
      }
      else {
        Curl_pgrsSetDownloadSize(pCVar16,-1);
        CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_00133ace:
      (conn->proto).imapc.state = IMAP_STOP;
      break;
    case IMAP_FETCH_FINAL:
      CVar9 = CURLE_WEIRD_SERVER_REPLY;
      goto LAB_00133901;
    case IMAP_APPEND:
      CVar9 = CURLE_UPLOAD_FAILED;
      if (local_6c == 0x2b) {
        pCVar16 = conn->data;
        Curl_pgrsSetUploadSize(pCVar16,(pCVar16->state).infilesize);
        CVar9 = CURLE_OK;
        Curl_setup_transfer(pCVar16,-1,-1,false,0);
        (conn->proto).imapc.state = IMAP_STOP;
      }
      break;
    case IMAP_APPEND_FINAL:
      CVar9 = CURLE_UPLOAD_FAILED;
LAB_00133901:
      if (local_6c == 1) {
switchD_00133576_caseD_4:
        (conn->proto).imapc.state = IMAP_STOP;
LAB_00133914:
        CVar9 = CURLE_OK;
      }
    }
LAB_00133b34:
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
    _Var8 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var8) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}